

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O3

void read1_cb(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 extraout_RAX;
  long lVar3;
  undefined8 in_R9;
  int64_t eval_b;
  int64_t eval_a;
  uv_buf_t uStack_d8;
  undefined8 uStack_c0;
  code *pcStack_b8;
  long lStack_a8;
  long lStack_a0;
  sockaddr_in sStack_98;
  uv_connect_t uStack_88;
  
  if (tcp == (uv_stream_t *)0x0) {
LAB_001ca730:
    read1_cb_cold_3();
  }
  else {
    if (-1 < nread) {
      if (nread != 0) {
        lVar3 = 0;
        do {
          if (buf->base[lVar3] != 'P') {
            read1_cb_cold_2();
            goto LAB_001ca730;
          }
          lVar3 = lVar3 + 1;
        } while (nread != lVar3);
      }
      return;
    }
    if (nread == -0xfff) {
      puts("GOT EOF");
      uv_close((uv_handle_t *)tcp,close_cb);
      return;
    }
  }
  read1_cb_cold_1();
  pcStack_b8 = (code *)0x1ca762;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_98);
  uStack_88.data = (void *)(long)iVar1;
  lStack_a8 = 0;
  if (uStack_88.data == (void *)0x0) {
    pcStack_b8 = (code *)0x1ca787;
    puVar2 = uv_default_loop();
    pcStack_b8 = (code *)0x1ca796;
    iVar1 = uv_timer_init(puVar2,&timer_handle);
    uStack_88.data = (void *)(long)iVar1;
    lStack_a8 = 0;
    if (uStack_88.data != (void *)0x0) goto LAB_001ca8c1;
    pcStack_b8 = (code *)0x1ca7bb;
    puVar2 = uv_default_loop();
    pcStack_b8 = (code *)0x1ca7ca;
    iVar1 = uv_tcp_init(puVar2,&tcp_handle);
    uStack_88.data = (void *)(long)iVar1;
    lStack_a8 = 0;
    if (uStack_88.data != (void *)0x0) goto LAB_001ca8d0;
    pcStack_b8 = (code *)0x1ca807;
    iVar1 = uv_tcp_connect(&uStack_88,&tcp_handle,(sockaddr *)&sStack_98,connect_cb);
    lStack_a8 = (long)iVar1;
    lStack_a0 = 0;
    if (lStack_a8 != 0) goto LAB_001ca8df;
    pcStack_b8 = (code *)0x1ca82c;
    puVar2 = uv_default_loop();
    pcStack_b8 = (code *)0x1ca836;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_a8 = (long)iVar1;
    lStack_a0 = 0;
    if (lStack_a8 != 0) goto LAB_001ca8ee;
    pcStack_b8 = (code *)0x1ca85b;
    puVar2 = uv_default_loop();
    pcStack_b8 = (code *)0x1ca86f;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    pcStack_b8 = (code *)0x1ca879;
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_a8 = 0;
    pcStack_b8 = (code *)0x1ca887;
    puVar2 = uv_default_loop();
    pcStack_b8 = (code *)0x1ca88f;
    iVar1 = uv_loop_close(puVar2);
    lStack_a0 = (long)iVar1;
    if (lStack_a8 == lStack_a0) {
      pcStack_b8 = (code *)0x1ca8a7;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_b8 = (code *)0x1ca8c1;
    run_test_tcp_read_stop_cold_1();
LAB_001ca8c1:
    pcStack_b8 = (code *)0x1ca8d0;
    run_test_tcp_read_stop_cold_2();
LAB_001ca8d0:
    pcStack_b8 = (code *)0x1ca8df;
    run_test_tcp_read_stop_cold_3();
LAB_001ca8df:
    pcStack_b8 = (code *)0x1ca8ee;
    run_test_tcp_read_stop_cold_4();
LAB_001ca8ee:
    pcStack_b8 = (code *)0x1ca8fd;
    run_test_tcp_read_stop_cold_5();
  }
  iVar1 = (int)&lStack_a0;
  pcStack_b8 = connect_cb;
  run_test_tcp_read_stop_cold_6();
  pcStack_b8 = (code *)(long)iVar1;
  uStack_c0 = 0;
  if (pcStack_b8 == (code *)0x0) {
    uStack_d8.len = 0x1ca947;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
    pcStack_b8 = (code *)(long)iVar1;
    uStack_c0 = 0;
    if (pcStack_b8 == (code *)0x0) {
      uStack_d8.len = 0x1ca979;
      iVar1 = uv_read_start((uv_stream_t *)&tcp_handle,fail_cb,fail_cb);
      pcStack_b8 = (code *)(long)iVar1;
      uStack_c0 = 0;
      if (pcStack_b8 == (code *)0x0) {
        return;
      }
      goto LAB_001ca9b8;
    }
  }
  else {
    uStack_d8.len = 0x1ca9a9;
    connect_cb_cold_1();
  }
  uStack_d8.len = 0x1ca9b8;
  connect_cb_cold_2();
LAB_001ca9b8:
  uStack_d8.len = (size_t)timer_cb;
  connect_cb_cold_3();
  uStack_d8 = uv_buf_init("PING",4);
  iVar1 = uv_write(&write_req,(uv_stream_t *)&tcp_handle,&uStack_d8,1,write_cb);
  if (iVar1 == 0) {
    iVar1 = uv_read_stop((uv_stream_t *)&tcp_handle);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    timer_cb_cold_1();
  }
  timer_cb_cold_2();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-read-stop.c"
          ,0x1f,"0 && \"fail_cb called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

static void read1_cb(uv_stream_t* tcp, ssize_t nread, const uv_buf_t* buf) {
  int i;
  ASSERT_NOT_NULL(tcp);

  if (nread >= 0) {
    for (i = 0; i < nread; ++i)
      ASSERT_EQ(buf->base[i], 'P');
  } else {
    ASSERT_EQ(nread, UV_EOF);
    printf("GOT EOF\n");
    uv_close((uv_handle_t*)tcp, close_cb);
  }
}